

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlC14NMode xVar2;
  xmlC14NVisibleNsStackPtr p_Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  xmlNodePtr pxVar10;
  xmlURIPtr uri;
  xmlListPtr l;
  void *pvVar11;
  xmlNodePtr pxVar12;
  xmlChar *pxVar13;
  xmlChar *base;
  byte bVar14;
  xmlChar *pxVar15;
  undefined7 uVar16;
  long lVar17;
  code *cur_00;
  char *pcVar18;
  xmlOutputBufferPtr out;
  undefined1 *ns;
  _xmlAttr *data;
  xmlAttrPtr pxVar19;
  _xmlNode *p_Var20;
  xmlNs *pxVar21;
  bool bVar22;
  char *in_stack_ffffffffffffff98;
  xmlNodePtr local_50;
  xmlNodePtr local_48;
  int local_3c;
  int local_38;
  uint local_34;
  
  cur_00 = (code *)cur;
  if (cur == (xmlNodePtr)0x0) {
    iVar7 = 0;
  }
  else {
    do {
      iVar6 = 1;
      if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
        cur_00 = (code *)cur;
        iVar6 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
      }
      xVar1 = cur->type;
      if (0x13 < xVar1 - XML_ELEMENT_NODE) {
        in_stack_ffffffffffffff98 =
             (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),xVar1);
        cur_00 = (code *)0x0;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,0x15,0x7a2,XML_ERR_ERROR,(char *)0x0,0,"processing node",
                        (char *)0x0,(char *)0x0,0,0,"Unknown node type %d found : %s\n",
                        in_stack_ffffffffffffff98,"processing node");
        goto LAB_00137751;
      }
      iVar8 = 0;
      pxVar15 = (xmlChar *)
                ((long)&switchD_001374f0::switchdataD_001e90f0 +
                (long)(int)(&switchD_001374f0::switchdataD_001e90f0)[xVar1 - XML_ELEMENT_NODE]);
      iVar7 = 0;
      switch(xVar1) {
      case XML_ELEMENT_NODE:
        for (pxVar21 = cur->nsDef; pxVar21 != (xmlNs *)0x0; pxVar21 = pxVar21->next) {
          iVar7 = xmlStrlen(pxVar21->href);
          if (0 < iVar7) {
            uri = xmlParseURI((char *)pxVar21->href);
            if (uri == (xmlURIPtr)0x0) {
              xmlC14NErrInternal("parsing namespace uri");
            }
            else {
              iVar7 = xmlStrlen((xmlChar *)uri->scheme);
              if (iVar7 != 0) {
                xmlFreeURI(uri);
                goto LAB_00137740;
              }
              in_stack_ffffffffffffff98 = uri->scheme;
              cur_00 = (code *)0x0;
              __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                              (void *)0x0,(void *)0x0,0x15,0x7a3,XML_ERR_ERROR,(char *)0x0,0,
                              (char *)0x0,(char *)0x0,(char *)0x0,0,0,
                              "Relative namespace UR is invalid here : %s\n",
                              in_stack_ffffffffffffff98);
              xmlFreeURI(uri);
            }
            xmlC14NErrInternal("checking for relative namespaces");
            iVar7 = -1;
            goto switchD_001374f0_caseD_a;
          }
LAB_00137740:
        }
        p_Var3 = ctx->ns_rendered;
        if (p_Var3 == (xmlC14NVisibleNsStackPtr)0x0) {
          xmlC14NErrParam("saving namespaces stack");
          iVar7 = 0;
          local_34 = 0;
          local_38 = 0;
        }
        else {
          iVar7 = p_Var3->nsCurEnd;
          local_34 = p_Var3->nsPrevStart;
          pxVar15 = (xmlChar *)(ulong)local_34;
          local_38 = p_Var3->nsPrevEnd;
        }
        if (iVar6 == 0) {
          local_3c = 0;
        }
        else {
          local_3c = ctx->parent_is_doc;
          if (local_3c == 0) {
            local_3c = 0;
          }
          else {
            ctx->pos = XMLC14N_INSIDE_DOCUMENT_ELEMENT;
            ctx->parent_is_doc = 0;
          }
          xmlOutputBufferWriteString(ctx->buf,"<");
          if ((cur->ns != (xmlNs *)0x0) && (iVar8 = xmlStrlen(cur->ns->prefix), 0 < iVar8)) {
            xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
            xmlOutputBufferWriteString(ctx->buf,":");
          }
          cur_00 = (code *)cur->name;
          xmlOutputBufferWriteString(ctx->buf,(char *)cur_00);
        }
        if (ctx->mode == XML_C14N_EXCLUSIVE_1_0) {
          if (cur->type == XML_ELEMENT_NODE) {
            cur_00 = xmlC14NNsCompare;
            local_50 = (xmlNodePtr)xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
            if (local_50 != (xmlNodePtr)0x0) {
              if ((ctx->inclusive_ns_prefixes == (xmlChar **)0x0) ||
                 (pxVar13 = *ctx->inclusive_ns_prefixes, pxVar13 == (xmlChar *)0x0)) {
                bVar4 = false;
                bVar5 = false;
              }
              else {
                bVar5 = false;
                lVar17 = 8;
                bVar4 = false;
                do {
                  iVar8 = xmlStrEqual(pxVar13,(xmlChar *)"#default");
                  if ((iVar8 != 0) || (iVar8 = xmlStrEqual(pxVar13,""), iVar8 != 0)) {
                    bVar5 = true;
                    pxVar13 = (xmlChar *)0x0;
                  }
                  pxVar10 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,pxVar13);
                  if (((pxVar10 != (xmlNodePtr)0x0) &&
                      (iVar8 = xmlC14NIsXmlNs((xmlNsPtr)pxVar10), iVar8 == 0)) &&
                     ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                      (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), iVar8 != 0))
                     )) {
                    iVar8 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar10);
                    if (iVar6 != 0) {
                      xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar10,cur);
                    }
                    if (iVar8 == 0) {
                      xmlListInsert((xmlListPtr)local_50,pxVar10);
                    }
                    iVar8 = xmlStrlen((xmlChar *)pxVar10->children);
                    if (iVar8 == 0) {
                      bVar4 = true;
                    }
                  }
                  pxVar13 = *(xmlChar **)((long)ctx->inclusive_ns_prefixes + lVar17);
                  lVar17 = lVar17 + 8;
                } while (pxVar13 != (xmlChar *)0x0);
              }
              pxVar10 = (xmlNodePtr)cur->ns;
              bVar22 = pxVar10 == (xmlNodePtr)0x0;
              if (bVar22) {
                pxVar10 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
              }
              if ((pxVar10 != (xmlNodePtr)0x0) &&
                 (iVar8 = xmlC14NIsXmlNs((xmlNsPtr)pxVar10), iVar8 == 0)) {
                if (iVar6 != 0) {
                  if (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                      (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), iVar8 != 0))
                     && (iVar8 = xmlExcC14NVisibleNsStackFind
                                           (ctx->ns_rendered,(xmlNsPtr)pxVar10,ctx), iVar8 == 0)) {
                    xmlListInsert((xmlListPtr)local_50,pxVar10);
                  }
                  xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar10,cur);
                }
                iVar8 = xmlStrlen((xmlChar *)pxVar10->children);
                if (iVar8 == 0) {
                  bVar4 = true;
                }
              }
              for (pxVar10 = (xmlNodePtr)cur->properties; pxVar10 != (xmlNodePtr)0x0;
                  pxVar10 = pxVar10->next) {
                if (((pxVar10->ns == (xmlNsPtr)0x0) ||
                    (iVar8 = xmlC14NIsXmlNs(pxVar10->ns), iVar8 != 0)) ||
                   ((ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0 &&
                    (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), iVar8 == 0))))
                {
                  if (((pxVar10->ns != (xmlNs *)0x0) &&
                      (iVar8 = xmlStrlen(pxVar10->ns->prefix), iVar8 == 0)) &&
                     (iVar8 = xmlStrlen(pxVar10->ns->href), iVar8 == 0)) {
                    bVar22 = true;
                  }
                }
                else {
                  iVar8 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,pxVar10->ns,ctx);
                  xmlC14NVisibleNsStackAdd(ctx->ns_rendered,pxVar10->ns,cur);
                  if ((iVar6 != 0) && (iVar8 == 0)) {
                    xmlListInsert((xmlListPtr)local_50,pxVar10->ns);
                  }
                  iVar8 = xmlStrlen(pxVar10->ns->prefix);
                  if (iVar8 == 0) {
                    bVar4 = true;
                  }
                }
              }
              uVar16 = (undefined7)((ulong)pxVar15 >> 8);
              pxVar15 = (xmlChar *)CONCAT71(uVar16,!bVar22 || iVar6 == 0);
              if ((bVar4 || bVar5) || (!bVar22 || iVar6 == 0)) {
                bVar14 = (iVar6 != 0 && !bVar4) & bVar5;
                pxVar15 = (xmlChar *)CONCAT71(uVar16,bVar14);
                if (bVar14 != 1) goto LAB_00137e7c;
                xmlExcC14NProcessNamespacesAxis_ns_default_66._32_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default_66._40_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default_66._16_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default_66._24_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default_66._0_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default_66._8_8_ = 0;
                ns = xmlExcC14NProcessNamespacesAxis_ns_default_66;
                iVar8 = xmlC14NVisibleNsStackFind
                                  (ctx->ns_rendered,
                                   (xmlNsPtr)xmlExcC14NProcessNamespacesAxis_ns_default_66);
              }
              else {
                xmlExcC14NProcessNamespacesAxis_ns_default._32_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default._40_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default._16_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default._24_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default._0_8_ = 0;
                xmlExcC14NProcessNamespacesAxis_ns_default._8_8_ = 0;
                ns = xmlExcC14NProcessNamespacesAxis_ns_default;
                iVar8 = xmlExcC14NVisibleNsStackFind
                                  (ctx->ns_rendered,
                                   (xmlNsPtr)xmlExcC14NProcessNamespacesAxis_ns_default,ctx);
              }
joined_r0x00137b81:
              if (iVar8 == 0) {
                xmlC14NPrintNamespaces((xmlNsPtr)ns,ctx);
              }
              goto LAB_00137e7c;
            }
            pcVar18 = "creating namespaces list (exc c14n)";
LAB_00137e22:
            xmlC14NErrInternal(pcVar18);
          }
          else {
            pcVar18 = "processing namespaces axis (exc c14n)";
LAB_00137b9c:
            xmlC14NErrParam(pcVar18);
          }
          pcVar18 = "processing namespaces axis";
        }
        else {
          if (cur->type != XML_ELEMENT_NODE) {
            pcVar18 = "processing namespaces axis (c14n)";
            goto LAB_00137b9c;
          }
          cur_00 = xmlC14NNsCompare;
          local_50 = (xmlNodePtr)xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
          if (local_50 == (xmlNodePtr)0x0) {
            pcVar18 = "creating namespaces list (c14n)";
            goto LAB_00137e22;
          }
          bVar4 = false;
          for (p_Var20 = cur; p_Var20 != (xmlNodePtr)0x0; p_Var20 = p_Var20->parent) {
            for (pxVar10 = (xmlNodePtr)p_Var20->nsDef; pxVar10 != (xmlNodePtr)0x0;
                pxVar10 = (xmlNodePtr)pxVar10->_private) {
              pxVar12 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)pxVar10->children);
              if (((pxVar12 == pxVar10) && (iVar8 = xmlC14NIsXmlNs((xmlNsPtr)pxVar10), iVar8 == 0))
                 && ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                     (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), iVar8 != 0)))
                 ) {
                iVar8 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar10);
                if (iVar6 != 0) {
                  xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar10,cur);
                }
                if (iVar8 == 0) {
                  xmlListInsert((xmlListPtr)local_50,pxVar10);
                }
                iVar8 = xmlStrlen((xmlChar *)pxVar10->children);
                if (iVar8 == 0) {
                  bVar4 = true;
                }
              }
            }
          }
          if ((iVar6 != 0) && (!bVar4)) {
            xmlC14NProcessNamespacesAxis_ns_default._32_8_ = 0;
            xmlC14NProcessNamespacesAxis_ns_default._40_8_ = 0;
            xmlC14NProcessNamespacesAxis_ns_default._16_8_ = 0;
            xmlC14NProcessNamespacesAxis_ns_default._24_8_ = 0;
            xmlC14NProcessNamespacesAxis_ns_default._0_8_ = 0;
            xmlC14NProcessNamespacesAxis_ns_default._8_8_ = 0;
            iVar8 = xmlC14NVisibleNsStackFind
                              (ctx->ns_rendered,(xmlNsPtr)xmlC14NProcessNamespacesAxis_ns_default);
            ns = xmlC14NProcessNamespacesAxis_ns_default;
            goto joined_r0x00137b81;
          }
LAB_00137e7c:
          cur_00 = xmlC14NPrintNamespacesWalker;
          xmlListWalk((xmlListPtr)local_50,xmlC14NPrintNamespacesWalker,ctx);
          xmlListDelete((xmlListPtr)local_50);
          if (iVar6 != 0) {
            p_Var3 = ctx->ns_rendered;
            if (p_Var3 == (xmlC14NVisibleNsStackPtr)0x0) {
              xmlC14NErrParam("shifting namespaces stack");
            }
            else {
              pxVar15 = (xmlChar *)(ulong)(uint)p_Var3->nsCurEnd;
              p_Var3->nsPrevStart = p_Var3->nsPrevEnd;
              p_Var3->nsPrevEnd = p_Var3->nsCurEnd;
            }
          }
          if (cur->type == XML_ELEMENT_NODE) {
            cur_00 = xmlC14NAttrsCompare;
            l = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
            if (l != (xmlListPtr)0x0) {
              xVar2 = ctx->mode;
              if (xVar2 == XML_C14N_1_1) {
                pxVar10 = (xmlNodePtr)cur->properties;
                if (pxVar10 == (xmlNodePtr)0x0) {
                  local_48 = (xmlNodePtr)0x0;
                  local_50 = (xmlNodePtr)0x0;
                  pxVar12 = (xmlNodePtr)0x0;
                }
                else {
                  pxVar12 = (xmlNodePtr)0x0;
                  local_50 = (xmlNodePtr)0x0;
                  local_48 = (xmlNodePtr)0x0;
                  do {
                    if (((iVar6 == 0) || (pxVar10->ns == (xmlNsPtr)0x0)) ||
                       (iVar8 = xmlC14NIsXmlNs(pxVar10->ns), iVar8 == 0)) {
LAB_00138097:
                      if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                         (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur),
                         iVar8 != 0)) {
                        xmlListInsert(l,pxVar10);
                      }
                    }
                    else {
                      pxVar15 = (xmlChar *)0x0;
                      bVar4 = true;
                      if (local_50 == (xmlNodePtr)0x0) {
                        iVar8 = xmlStrEqual(pxVar10->name,"lang");
                        if (iVar8 == 0) {
                          local_50 = (xmlNodePtr)0x0;
                          pxVar15 = (xmlChar *)0x0;
                        }
                        else {
                          pxVar15 = &DAT_00000001;
                          bVar4 = false;
                          local_50 = pxVar10;
                        }
                      }
                      if ((bVar4) && (pxVar12 == (xmlNodePtr)0x0)) {
                        iVar8 = xmlStrEqual(pxVar10->name,"space");
                        pxVar15 = (xmlChar *)(ulong)(iVar8 != 0);
                        pxVar12 = (xmlNodePtr)0x0;
                        if (iVar8 != 0) {
                          pxVar12 = pxVar10;
                        }
                      }
                      if (((int)pxVar15 == 0) && (local_48 == (xmlNodePtr)0x0)) {
                        iVar8 = xmlStrEqual(pxVar10->name,"base");
                        pxVar15 = (xmlChar *)(ulong)(iVar8 != 0);
                        local_48 = (xmlNodePtr)0x0;
                        if (iVar8 != 0) {
                          local_48 = pxVar10;
                        }
                      }
                      if ((int)pxVar15 == 0) goto LAB_00138097;
                    }
                    pxVar10 = pxVar10->next;
                  } while (pxVar10 != (_xmlNode *)0x0);
                }
                if (iVar6 != 0) {
                  if (local_50 == (xmlNodePtr)0x0) {
                    local_50 = (xmlNodePtr)
                               xmlC14NFindHiddenParentAttr(ctx,cur->parent,"lang",pxVar15);
                  }
                  if (local_50 != (xmlNodePtr)0x0) {
                    xmlListInsert(l,local_50);
                  }
                  if (pxVar12 == (xmlNodePtr)0x0) {
                    pxVar12 = (xmlNodePtr)
                              xmlC14NFindHiddenParentAttr(ctx,cur->parent,"space",pxVar15);
                  }
                  if (pxVar12 != (xmlNodePtr)0x0) {
                    xmlListInsert(l,pxVar12);
                  }
                  if (local_48 == (xmlNodePtr)0x0) {
                    local_48 = (xmlNodePtr)
                               xmlC14NFindHiddenParentAttr(ctx,cur->parent,"base",pxVar15);
                  }
                  if (local_48 == (xmlNodePtr)0x0) goto LAB_001383e1;
                  if (local_48->parent == (_xmlNode *)0x0) {
                    xmlC14NErrParam("processing xml:base attribute");
LAB_001383c4:
                    pxVar19 = (xmlAttrPtr)0x0;
                  }
                  else {
                    pxVar15 = xmlNodeListGetString(ctx->doc,local_48->children,1);
                    if (pxVar15 == (xmlChar *)0x0) {
LAB_001383b8:
                      pcVar18 = "processing xml:base attribute - can\'t get attr value";
LAB_001383bf:
                      xmlC14NErrInternal(pcVar18);
                      goto LAB_001383c4;
                    }
                    p_Var20 = local_48->parent->parent;
                    while (((p_Var20 != (xmlNode *)0x0 &&
                            (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0)) &&
                           (iVar8 = (*ctx->is_visible_callback)
                                              (ctx->user_data,p_Var20,p_Var20->parent), iVar8 == 0))
                          ) {
                      pxVar19 = xmlHasNsProp(p_Var20,"base",
                                             (xmlChar *)"http://www.w3.org/XML/1998/namespace");
                      pxVar13 = pxVar15;
                      if (pxVar19 != (xmlAttrPtr)0x0) {
                        pxVar13 = xmlNodeListGetString(ctx->doc,pxVar19->children,1);
                        if (pxVar13 == (xmlChar *)0x0) {
                          (*xmlFree)(pxVar15);
                          goto LAB_001383b8;
                        }
                        uVar9 = xmlStrlen(pxVar13);
                        base = pxVar13;
                        if (((1 < (int)uVar9) && (pxVar13[(ulong)uVar9 - 2] == '.')) &&
                           (base = xmlStrcat(pxVar13,"/"), base == (xmlChar *)0x0)) {
                          (*xmlFree)(pxVar13);
                          (*xmlFree)(pxVar15);
                          pcVar18 = "processing xml:base attribute - can\'t modify uri";
                          goto LAB_001383bf;
                        }
                        pxVar13 = xmlBuildURI(pxVar15,base);
                        (*xmlFree)(base);
                        (*xmlFree)(pxVar15);
                        if (pxVar13 == (xmlChar *)0x0) {
                          pcVar18 = "processing xml:base attribute - can\'t construct uri";
                          goto LAB_001383bf;
                        }
                      }
                      p_Var20 = p_Var20->parent;
                      pxVar15 = pxVar13;
                    }
                    iVar8 = xmlStrEqual(pxVar15,"");
                    if (iVar8 != 0) {
                      (*xmlFree)(pxVar15);
                      goto LAB_001383c4;
                    }
                    pxVar19 = xmlNewNsProp((xmlNodePtr)0x0,local_48->ns,"base",pxVar15);
                    (*xmlFree)(pxVar15);
                    if (pxVar19 == (xmlAttrPtr)0x0) {
                      pcVar18 = "processing xml:base attribute - can\'t construct attribute";
                      goto LAB_001383bf;
                    }
                  }
                  if (pxVar19 != (xmlAttrPtr)0x0) {
                    xmlListInsert(l,pxVar19);
                    pxVar19->next = (_xmlAttr *)0x0;
                    goto LAB_001383e4;
                  }
                  goto LAB_001383e1;
                }
LAB_00138318:
                xmlListWalk(l,xmlC14NPrintAttrs,ctx);
                xmlFreePropList((xmlAttrPtr)0x0);
                xmlListDelete(l);
              }
              else {
                if (xVar2 == XML_C14N_EXCLUSIVE_1_0) {
                  for (pxVar10 = (xmlNodePtr)cur->properties; pxVar10 != (xmlNodePtr)0x0;
                      pxVar10 = pxVar10->next) {
                    if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                       (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), iVar8 != 0)
                       ) {
                      xmlListInsert(l,pxVar10);
                    }
                  }
LAB_001383e1:
                  pxVar19 = (xmlAttrPtr)0x0;
                }
                else {
                  if (xVar2 != XML_C14N_1_0) goto LAB_001383e1;
                  for (pxVar10 = (xmlNodePtr)cur->properties; pxVar10 != (xmlNodePtr)0x0;
                      pxVar10 = pxVar10->next) {
                    if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                       (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,cur), iVar8 != 0)
                       ) {
                      xmlListInsert(l,pxVar10);
                    }
                  }
                  if (iVar6 == 0) goto LAB_00138318;
                  pxVar10 = cur->parent;
                  if ((((pxVar10 == (xmlNodePtr)0x0) ||
                       (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0)) ||
                      (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar10,pxVar10->parent),
                      iVar8 != 0)) || (p_Var20 = cur->parent, p_Var20 == (_xmlNode *)0x0))
                  goto LAB_001383e1;
                  do {
                    for (data = p_Var20->properties; data != (_xmlAttr *)0x0; data = data->next) {
                      if (((data->ns != (xmlNsPtr)0x0) &&
                          (iVar8 = xmlC14NIsXmlNs(data->ns), iVar8 != 0)) &&
                         (pvVar11 = xmlListSearch(l,data), pvVar11 == (void *)0x0)) {
                        xmlListInsert(l,data);
                      }
                    }
                    p_Var20 = p_Var20->parent;
                    pxVar19 = (xmlAttrPtr)0x0;
                  } while (p_Var20 != (_xmlNode *)0x0);
                }
LAB_001383e4:
                xmlListWalk(l,xmlC14NPrintAttrs,ctx);
                xmlFreePropList(pxVar19);
                xmlListDelete(l);
                if (iVar6 != 0) {
                  xmlOutputBufferWriteString(ctx->buf,">");
                }
              }
              cur_00 = (code *)cur->children;
              if (((xmlNodePtr)cur_00 == (xmlNodePtr)0x0) ||
                 (iVar8 = xmlC14NProcessNodeList(ctx,(xmlNodePtr)cur_00), -1 < iVar8)) {
                if (iVar6 != 0) {
                  xmlOutputBufferWriteString(ctx->buf,"</");
                  if ((cur->ns != (xmlNs *)0x0) && (iVar6 = xmlStrlen(cur->ns->prefix), 0 < iVar6))
                  {
                    xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(ctx->buf,":");
                  }
                  xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
                  cur_00 = (code *)0x2072f4;
                  xmlOutputBufferWriteString(ctx->buf,">");
                  if (local_3c != 0) {
                    ctx->parent_is_doc = local_3c;
                    ctx->pos = XMLC14N_AFTER_DOCUMENT_ELEMENT;
                  }
                }
                p_Var3 = ctx->ns_rendered;
                if (p_Var3 == (xmlC14NVisibleNsStackPtr)0x0) {
                  xmlC14NErrParam("restoring namespaces stack");
                }
                else {
                  p_Var3->nsCurEnd = iVar7;
                  p_Var3->nsPrevStart = local_34;
                  p_Var3->nsPrevEnd = local_38;
                }
                iVar7 = 0;
                break;
              }
              pcVar18 = "processing childrens list";
              goto LAB_00137f5e;
            }
            xmlC14NErrInternal("creating attributes list");
          }
          else {
            xmlC14NErrParam("processing attributes axis");
          }
          pcVar18 = "processing attributes axis";
        }
LAB_00137f5e:
        xmlC14NErrInternal(pcVar18);
        goto LAB_00137751;
      case XML_ATTRIBUTE_NODE:
        pcVar18 = "XML_ATTRIBUTE_NODE";
        goto LAB_0013774c;
      case XML_TEXT_NODE:
      case XML_CDATA_SECTION_NODE:
        iVar7 = iVar8;
        if ((iVar6 != 0) && (cur->content != (xmlChar *)0x0)) {
          cur_00 = (code *)&DAT_00000003;
          pxVar10 = (xmlNodePtr)xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_TEXT);
          if (pxVar10 == (xmlNodePtr)0x0) {
            xmlC14NErrInternal("normalizing text node");
          }
          else {
            cur_00 = (code *)pxVar10;
            xmlOutputBufferWriteString(ctx->buf,(char *)pxVar10);
            (*xmlFree)(pxVar10);
          }
          iVar7 = -(uint)(pxVar10 == (xmlNodePtr)0x0);
        }
        break;
      case XML_ENTITY_REF_NODE:
        pcVar18 = "XML_ENTITY_REF_NODE";
        goto LAB_0013774c;
      case XML_ENTITY_NODE:
        pcVar18 = "XML_ENTITY_NODE";
        goto LAB_0013774c;
      case XML_PI_NODE:
        iVar7 = iVar8;
        if (iVar6 != 0) {
          pcVar18 = "<?";
          if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
            pcVar18 = "\n<?";
          }
          xmlOutputBufferWriteString(ctx->buf,pcVar18);
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
          if ((cur->content != (xmlChar *)0x0) && (*cur->content != '\0')) {
            xmlOutputBufferWriteString(ctx->buf," ");
            cur_00 = (code *)&DAT_00000002;
            pxVar15 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_PI);
            if (pxVar15 == (xmlChar *)0x0) {
              xmlC14NErrInternal("normalizing pi node");
              goto LAB_00137751;
            }
            xmlOutputBufferWriteString(ctx->buf,(char *)pxVar15);
            (*xmlFree)(pxVar15);
          }
          out = ctx->buf;
          if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
            cur_00 = (code *)"?>\n";
          }
          else {
            cur_00 = (code *)0x1f8435;
          }
LAB_00137c1a:
          xmlOutputBufferWriteString(out,(char *)cur_00);
          iVar7 = iVar8;
        }
        break;
      case XML_COMMENT_NODE:
        iVar7 = iVar8;
        if ((iVar6 != 0) && (ctx->with_comments != 0)) {
          pcVar18 = "<!--";
          if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
            pcVar18 = "\n<!--";
          }
          xmlOutputBufferWriteString(ctx->buf,pcVar18);
          if (cur->content != (xmlChar *)0x0) {
            cur_00 = (code *)&DAT_00000001;
            pxVar15 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_COMMENT);
            if (pxVar15 == (xmlChar *)0x0) {
              xmlC14NErrInternal("normalizing comment node");
              goto LAB_00137751;
            }
            xmlOutputBufferWriteString(ctx->buf,(char *)pxVar15);
            (*xmlFree)(pxVar15);
          }
          if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
            out = ctx->buf;
            cur_00 = (code *)"-->\n";
          }
          else {
            out = ctx->buf;
            cur_00 = (code *)0x1f5b87;
          }
          goto LAB_00137c1a;
        }
        break;
      case XML_DOCUMENT_NODE:
      case XML_DOCUMENT_FRAG_NODE:
      case XML_HTML_DOCUMENT_NODE:
        cur_00 = (code *)cur->children;
        if ((xmlNodePtr)cur_00 != (xmlNodePtr)0x0) {
          ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
          ctx->parent_is_doc = 1;
          iVar7 = xmlC14NProcessNodeList(ctx,(xmlNodePtr)cur_00);
        }
        break;
      case XML_NAMESPACE_DECL:
        pcVar18 = "XML_NAMESPACE_DECL";
LAB_0013774c:
        xmlC14NErrInvalidNode(pcVar18,(char *)cur_00);
LAB_00137751:
        iVar7 = -1;
      }
switchD_001374f0_caseD_a:
      cur = cur->next;
    } while ((cur != (_xmlNode *)0x0) && (-1 < iVar7));
  }
  return iVar7;
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam("processing node list");
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}